

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

QTextTable *
QTextTablePrivate::createTable
          (QTextDocumentPrivate *pieceTable,int pos,int rows,int cols,QTextTableFormat *tableFormat)

{
  long lVar1;
  int iVar2;
  Operation op;
  int iVar3;
  uint uVar4;
  QTextTable *pQVar5;
  QTextTablePrivate *pQVar6;
  int in_ECX;
  int in_EDX;
  QTextDocumentPrivate *in_RDI;
  QTextDocumentPrivate *in_R8;
  long in_FS_OFFSET;
  int i;
  QTextTablePrivate *d;
  int cellIdx;
  int charIdx;
  QTextTable *table;
  QTextCharFormat charFmt;
  QTextTableFormat fmt;
  QTextTableFormat *in_stack_ffffffffffffff48;
  QTextDocumentPrivate *in_stack_ffffffffffffff50;
  QTextFormat *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  QTextFormat *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QTextFormatCollection *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QChar local_3e;
  QChar local_3c;
  QChar local_3a [4];
  QChar in_stack_ffffffffffffffce;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTextTableFormat::QTextTableFormat
            ((QTextTableFormat *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  QTextTableFormat::setColumns
            ((QTextTableFormat *)in_stack_ffffffffffffff58,
             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  QTextDocumentPrivate::createObject
            ((QTextDocumentPrivate *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QTextFormat *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  pQVar5 = qobject_cast<QTextTable*>((QObject *)0x8954e2);
  QTextDocumentPrivate::beginEditBlock(in_RDI);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x89551c);
  QTextObject::objectIndex((QTextObject *)in_stack_ffffffffffffff50);
  QTextFormat::setObjectIndex(in_stack_ffffffffffffff68,iVar2);
  QTextFormat::setObjectType
            (in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  QTextDocumentPrivate::formatCollection(in_RDI);
  iVar2 = QTextFormatCollection::indexForFormat
                    (in_stack_ffffffffffffff78,
                     (QTextFormat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QTextDocumentPrivate::formatCollection(in_RDI);
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)0x895581);
  op = QTextFormatCollection::indexForFormat
                 (in_stack_ffffffffffffff78,
                  (QTextFormat *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x8955a4);
  pQVar6 = QTextTable::d_func((QTextTable *)0x8955b6);
  pQVar6->blockFragmentUpdates = true;
  QChar::QChar<char16_t,_true>(local_3a,L'﷐');
  iVar3 = QTextDocumentPrivate::insertBlock
                    (in_R8,in_stack_ffffffffffffffce,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,iVar2,
                     op);
  *(int *)&(pQVar6->super_QTextFramePrivate).super_QTextObjectPrivate.field_0x84 = iVar3;
  QList<int>::append((QList<int> *)0x89562b,
                     (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  for (iVar3 = 1; iVar3 < in_EDX * in_ECX; iVar3 = iVar3 + 1) {
    QChar::QChar<char16_t,_true>(&local_3c,L'﷐');
    QTextDocumentPrivate::insertBlock
              (in_R8,in_stack_ffffffffffffffce,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,iVar2,op);
    QList<int>::append((QList<int> *)0x8956a6,
                       (parameter_type)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  }
  QChar::QChar<char16_t,_true>(&local_3e,L'﷑');
  uVar4 = QTextDocumentPrivate::insertBlock
                    (in_R8,in_stack_ffffffffffffffce,(int)((ulong)pQVar5 >> 0x20),(int)pQVar5,iVar2,
                     op);
  (pQVar6->super_QTextFramePrivate).fragment_end = uVar4;
  pQVar6->blockFragmentUpdates = false;
  pQVar6->dirty = true;
  QTextDocumentPrivate::endEditBlock(in_stack_ffffffffffffff50);
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x895747);
  QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x895754);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

QTextTable *QTextTablePrivate::createTable(QTextDocumentPrivate *pieceTable, int pos, int rows, int cols, const QTextTableFormat &tableFormat)
{
    QTextTableFormat fmt = tableFormat;
    fmt.setColumns(cols);
    QTextTable *table = qobject_cast<QTextTable *>(pieceTable->createObject(fmt));
    Q_ASSERT(table);

    pieceTable->beginEditBlock();

//     qDebug("---> createTable: rows=%d, cols=%d at %d", rows, cols, pos);
    // add block after table
    QTextCharFormat charFmt;
    charFmt.setObjectIndex(table->objectIndex());
    charFmt.setObjectType(QTextFormat::TableCellObject);


    int charIdx = pieceTable->formatCollection()->indexForFormat(charFmt);
    int cellIdx = pieceTable->formatCollection()->indexForFormat(QTextBlockFormat());

    QTextTablePrivate *d = table->d_func();
    d->blockFragmentUpdates = true;

    d->fragment_start = pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx);
    d->cells.append(d->fragment_start);
    ++pos;

    for (int i = 1; i < rows*cols; ++i) {
        d->cells.append(pieceTable->insertBlock(QTextBeginningOfFrame, pos, cellIdx, charIdx));
//      qDebug("      addCell at %d", pos);
        ++pos;
    }

    d->fragment_end = pieceTable->insertBlock(QTextEndOfFrame, pos, cellIdx, charIdx);
//  qDebug("      addEOR at %d", pos);
    ++pos;

    d->blockFragmentUpdates = false;
    d->dirty = true;

    pieceTable->endEditBlock();

    return table;
}